

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleterPrivate::showPopup(QCompleterPrivate *this,QRect *rect)

{
  bool bVar1;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  int ax;
  int iVar5;
  int iVar6;
  int iVar7;
  QAbstractItemModel *pQVar8;
  int *piVar9;
  QScrollBar *pQVar10;
  long in_RDI;
  long in_FS_OFFSET;
  QScrollBar *hsb;
  int w;
  int rh;
  LayoutDirection dir;
  int bottom;
  int top;
  int h;
  QPoint pos;
  QRect screen;
  QRect *in_stack_ffffffffffffff08;
  int xpos;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QWidget *in_stack_ffffffffffffff38;
  int local_94;
  int local_90;
  int local_74;
  int local_70;
  int local_6c [3];
  QPoint local_60;
  QPoint local_58;
  QPoint local_50;
  undefined8 local_48;
  undefined1 local_40 [24];
  int local_28;
  int local_24;
  QPoint local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d587);
  QWidget::screen(in_stack_ffffffffffffff38);
  local_18 = QScreen::availableGeometry();
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d5b5);
  LVar2 = QWidget::layoutDirection((QWidget *)0xa6d5bd);
  local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  iVar3 = (**(code **)(**(long **)(in_RDI + 0x90) + 0x1f8))(*(long **)(in_RDI + 0x90),0);
  pQVar8 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  QModelIndex::QModelIndex((QModelIndex *)0xa6d63c);
  local_28 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8,local_40);
  piVar9 = qMin<int>((int *)(in_RDI + 0xc4),&local_28);
  local_24 = iVar3 * *piVar9 + 6;
  pQVar10 = QAbstractScrollArea::horizontalScrollBar
                      ((QAbstractScrollArea *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (pQVar10 != (QScrollBar *)0x0) {
    bVar1 = QWidget::isVisible((QWidget *)0xa6d6a7);
    if (bVar1) {
      pQVar10 = QAbstractScrollArea::horizontalScrollBar
                          ((QAbstractScrollArea *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_48 = (**(code **)(*(long *)&(pQVar10->super_QAbstractSlider).super_QWidget + 0x70))();
      iVar3 = QSize::height((QSize *)0xa6d6dc);
      local_24 = iVar3 + local_24;
    }
  }
  bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (bVar1) {
    local_90 = QRect::height(in_stack_ffffffffffffff08);
    local_94 = QRect::width(in_stack_ffffffffffffff08);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d727);
    if (LVar2 == RightToLeft) {
      local_58 = QRect::bottomRight(in_stack_ffffffffffffff08);
    }
    else {
      local_58 = QRect::bottomLeft(in_stack_ffffffffffffff08);
    }
    local_50 = QWidget::mapToGlobal
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_20 = local_50;
  }
  else {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d796);
    local_90 = QWidget::height((QWidget *)0xa6d79e);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d7b0);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d7c3);
    QWidget::height((QWidget *)0xa6d7cb);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08);
    local_60 = QWidget::mapToGlobal
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_20 = local_60;
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6d817);
    local_94 = QWidget::width((QWidget *)0xa6d81f);
  }
  iVar3 = local_94;
  iVar4 = QRect::width(in_stack_ffffffffffffff08);
  if (iVar4 < iVar3) {
    local_94 = QRect::width(in_stack_ffffffffffffff08);
  }
  iVar4 = QPoint::x((QPoint *)0xa6d860);
  iVar4 = iVar4 + local_94;
  ax = QRect::x((QRect *)0xa6d875);
  iVar5 = QRect::width(in_stack_ffffffffffffff08);
  if (ax + iVar5 < iVar4) {
    in_stack_ffffffffffffff20 = QRect::x((QRect *)0xa6d8a3);
    QRect::width(in_stack_ffffffffffffff08);
    QPoint::setX((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  xpos = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  iVar5 = QPoint::x((QPoint *)0xa6d8d8);
  iVar6 = QRect::x((QRect *)0xa6d8e9);
  if (iVar5 < iVar6) {
    QRect::x((QRect *)0xa6d900);
    QPoint::setX((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),xpos);
  }
  iVar6 = QPoint::y((QPoint *)0xa6d91c);
  iVar6 = iVar6 - local_90;
  iVar7 = QRect::top((QRect *)0xa6d931);
  local_6c[0] = (iVar6 - iVar7) + 2;
  iVar7 = QRect::bottom((QRect *)0xa6d950);
  local_70 = QPoint::y((QPoint *)0xa6d961);
  local_70 = iVar7 - local_70;
  local_74 = QWidget::minimumHeight((QWidget *)CONCAT44(iVar6,in_stack_ffffffffffffff10));
  piVar9 = qMax<int>(&local_24,&local_74);
  local_24 = *piVar9;
  if (local_70 < local_24) {
    piVar9 = qMax<int>(local_6c,&local_70);
    piVar9 = qMin<int>(piVar9,&local_24);
    local_24 = *piVar9;
    if (local_70 < local_6c[0]) {
      QPoint::y((QPoint *)0xa6da01);
      QPoint::setY((QPoint *)CONCAT44(iVar6,in_stack_ffffffffffffff10),xpos);
    }
  }
  QPoint::x((QPoint *)0xa6da3d);
  QPoint::y((QPoint *)0xa6da4e);
  QWidget::setGeometry((QWidget *)CONCAT44(iVar3,iVar4),ax,in_stack_ffffffffffffff20,iVar5,iVar7);
  bVar1 = QWidget::isVisible((QWidget *)0xa6da7a);
  if (!bVar1) {
    QWidget::show((QWidget *)CONCAT44(ax,in_stack_ffffffffffffff20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleterPrivate::showPopup(const QRect& rect)
{
    const QRect screen = widget->screen()->availableGeometry();
    Qt::LayoutDirection dir = widget->layoutDirection();
    QPoint pos;
    int rh, w;
    int h = (popup->sizeHintForRow(0) * qMin(maxVisibleItems, popup->model()->rowCount()) + 3) + 3;
    QScrollBar *hsb = popup->horizontalScrollBar();
    if (hsb && hsb->isVisible())
        h += popup->horizontalScrollBar()->sizeHint().height();

    if (rect.isValid()) {
        rh = rect.height();
        w = rect.width();
        pos = widget->mapToGlobal(dir == Qt::RightToLeft ? rect.bottomRight() : rect.bottomLeft());
    } else {
        rh = widget->height();
        pos = widget->mapToGlobal(QPoint(0, widget->height() - 2));
        w = widget->width();
    }

    if (w > screen.width())
        w = screen.width();
    if ((pos.x() + w) > (screen.x() + screen.width()))
        pos.setX(screen.x() + screen.width() - w);
    if (pos.x() < screen.x())
        pos.setX(screen.x());

    int top = pos.y() - rh - screen.top() + 2;
    int bottom = screen.bottom() - pos.y();
    h = qMax(h, popup->minimumHeight());
    if (h > bottom) {
        h = qMin(qMax(top, bottom), h);

        if (top > bottom)
            pos.setY(pos.y() - h - rh + 2);
    }

    popup->setGeometry(pos.x(), pos.y(), w, h);

    if (!popup->isVisible())
        popup->show();
}